

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_dns.c
# Opt level: O3

void PrintOutput(void *mem,sunrealtype t,N_Vector y)

{
  uint uVar1;
  undefined8 *puVar2;
  int kused;
  sunrealtype hused;
  long nst;
  uint local_2c;
  sunrealtype local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_28 = t;
  puVar2 = (undefined8 *)N_VGetArrayPointer(y);
  uVar1 = IDAGetLastOrder(mem,&local_2c);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetLastOrder",
            (ulong)uVar1);
  }
  uVar1 = IDAGetNumSteps(mem,&local_18);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetNumSteps",
            (ulong)uVar1);
  }
  uVar1 = IDAGetLastStep(mem,&local_20);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDAGetLastStep",
            (ulong)uVar1);
  }
  printf("%5.2f %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n",local_28,*puVar2,puVar2[1],puVar2[2],
         local_20,local_18,(ulong)local_2c);
  return;
}

Assistant:

static void PrintOutput(void* mem, sunrealtype t, N_Vector y)
{
  sunrealtype* yval;
  int retval, kused;
  long int nst;
  sunrealtype hused;

  yval = N_VGetArrayPointer(y);

  retval = IDAGetLastOrder(mem, &kused);
  check_retval(&retval, "IDAGetLastOrder", 1);
  retval = IDAGetNumSteps(mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetLastStep(mem, &hused);
  check_retval(&retval, "IDAGetLastStep", 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%5.2Lf %12.4Le %12.4Le %12.4Le | %3ld  %1d %12.4Le\n", t, yval[0],
         yval[1], yval[2], nst, kused, hused);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%5.2f %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n", t, yval[0], yval[1],
         yval[2], nst, kused, hused);
#else
  printf("%5.2f %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n", t, yval[0], yval[1],
         yval[2], nst, kused, hused);
#endif
}